

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O3

void ** __thiscall llvm::SmallPtrSetImplBase::find_imp(SmallPtrSetImplBase *this,void *Ptr)

{
  void **APtr;
  void **ppvVar1;
  ulong uVar2;
  long lVar3;
  
  ppvVar1 = this->SmallArray;
  if (this->CurArray == ppvVar1) {
    uVar2 = (ulong)this->NumNonEmpty;
    if (uVar2 != 0) {
      lVar3 = uVar2 * 8;
      do {
        if (*ppvVar1 == Ptr) {
          return ppvVar1;
        }
        ppvVar1 = ppvVar1 + 1;
        lVar3 = lVar3 + -8;
      } while (lVar3 != 0);
    }
    ppvVar1 = this->CurArray + uVar2;
  }
  else {
    ppvVar1 = FindBucketFor(this,Ptr);
    if (*ppvVar1 != Ptr) {
      ppvVar1 = this->CurArray + (&this->CurArraySize)[this->CurArray == this->SmallArray];
    }
  }
  return ppvVar1;
}

Assistant:

const void *const * find_imp(const void * Ptr) const {
    if (isSmall()) {
      // Linear search for the item.
      for (const void *const *APtr = SmallArray,
                      *const *E = SmallArray + NumNonEmpty; APtr != E; ++APtr)
        if (*APtr == Ptr)
          return APtr;
      return EndPointer();
    }

    // Big set case.
    auto *Bucket = FindBucketFor(Ptr);
    if (*Bucket == Ptr)
      return Bucket;
    return EndPointer();
  }